

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

SubControl __thiscall
QAbstractSpinBoxPrivate::newHoverControl(QAbstractSpinBoxPrivate *this,QPoint *pos)

{
  QWidget *this_00;
  SubControl SVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QStyleOptionSpinBox opt;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)local_88);
  (**(code **)(*(long *)this_00 + 0x1c0))(this_00,local_88);
  local_48 = (undefined1 *)
             CONCAT44(local_48._4_4_,(QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff);
  pQVar2 = QWidget::style(this_00);
  SVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,0,local_88,pos,this_00);
  this->hoverControl = SVar1;
  pQVar2 = QWidget::style(this_00);
  QVar3 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,0,local_88,this->hoverControl,this_00)
  ;
  this->hoverRect = QVar3;
  SVar1 = this->hoverControl;
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QAbstractSpinBoxPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QAbstractSpinBox);

    QStyleOptionSpinBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_SpinBox, &opt, pos, q);
    hoverRect = q->style()->subControlRect(QStyle::CC_SpinBox, &opt, hoverControl, q);
    return hoverControl;
}